

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

void do_cmd_delay(char *name,wchar_t unused)

{
  byte bVar1;
  _Bool _Var2;
  ushort uVar3;
  char *str;
  ulong uVar4;
  char local_18 [2];
  uint16_t val;
  wchar_t msec;
  char tmp [4];
  wchar_t unused_local;
  char *name_local;
  
  msec = unused;
  _tmp = name;
  memset(local_18,0,4);
  bVar1 = (player->opts).delay_factor;
  strnfmt(local_18,4,"%i",(ulong)(player->opts).delay_factor);
  screen_save();
  prt("",L'\x13',L'\0');
  prt("Command: Base Delay Factor",L'\x14',L'\0');
  prt("New base delay factor (0-255): ",L'\x15',L'\0');
  str = format("Current base delay factor: %d msec",(ulong)bVar1);
  prt(str,L'\x16',L'\0');
  prt("",L'\x17',L'\0');
  _Var2 = askfor_aux(local_18,4,askfor_aux_numbers);
  if (_Var2) {
    uVar4 = strtoul(local_18,(char **)0x0,0);
    uVar3 = (ushort)uVar4;
    if (0xff < uVar3) {
      uVar3 = 0xff;
    }
    (player->opts).delay_factor = (uint8_t)uVar3;
  }
  screen_load();
  return;
}

Assistant:

static void do_cmd_delay(const char *name, int unused)
{
	char tmp[4] = "";
	int msec = player->opts.delay_factor;

	strnfmt(tmp, sizeof(tmp), "%i", player->opts.delay_factor);

	screen_save();

	/* Prompt */
	prt("", 19, 0);
	prt("Command: Base Delay Factor", 20, 0);
	prt("New base delay factor (0-255): ", 21, 0);
	prt(format("Current base delay factor: %d msec", msec), 22, 0);
	prt("", 23, 0);

	/* Ask for a numeric value */
	if (askfor_aux(tmp, sizeof(tmp), askfor_aux_numbers)) {
		uint16_t val = (uint16_t) strtoul(tmp, NULL, 0);
		player->opts.delay_factor = MIN(val, 255);
	}

	screen_load();
}